

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

void * __thiscall
DeviceTy::getOrAllocTgtPtr
          (DeviceTy *this,void *HstPtrBegin,void *HstPtrBase,int64_t Size,bool *IsNew,
          bool IsImplicit,bool UpdateRefCount)

{
  iterator iVar1;
  void *pvVar2;
  LookupResult LVar3;
  value_type local_58;
  
  std::mutex::lock(&this->DataMapMtx);
  LVar3 = lookupMapping(this,HstPtrBegin,Size);
  iVar1 = LVar3.Entry._M_node;
  if ((((undefined1  [16])LVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
     (IsImplicit && ((undefined1  [16])LVar3 & (undefined1  [16])0x6) != (undefined1  [16])0x0)) {
    *IsNew = false;
    if (UpdateRefCount) {
      iVar1._M_node[3]._M_next = (_List_node_base *)((long)&(iVar1._M_node[3]._M_next)->_M_next + 1)
      ;
    }
    pvVar2 = (void *)(((long)HstPtrBegin + (long)iVar1._M_node[2]._M_prev) -
                     (long)iVar1._M_node[1]._M_prev);
    goto LAB_00102fd2;
  }
  if (((undefined1  [16])LVar3 & (undefined1  [16])0x6) == (undefined1  [16])0x0) {
    if (Size != 0) goto LAB_00103005;
  }
  else if (Size != 0 && IsImplicit) {
LAB_00103005:
    *IsNew = true;
    pvVar2 = (*this->RTL->data_alloc)(this->RTLDeviceID,Size,HstPtrBegin);
    local_58.HstPtrEnd = Size + (long)HstPtrBegin;
    local_58.RefCount = 1;
    local_58.HstPtrBase = (uintptr_t)HstPtrBase;
    local_58.HstPtrBegin = (uintptr_t)HstPtrBegin;
    local_58.TgtPtrBegin = (uintptr_t)pvVar2;
    std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::push_front
              (&this->HostDataToTargetMap,&local_58);
    goto LAB_00102fd2;
  }
  pvVar2 = (void *)0x0;
LAB_00102fd2:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return pvVar2;
}

Assistant:

void *DeviceTy::getOrAllocTgtPtr(void *HstPtrBegin, void *HstPtrBase,
    int64_t Size, bool &IsNew, bool IsImplicit, bool UpdateRefCount) {
  void *rc = NULL;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);

  // Check if the pointer is contained.
  if (lr.Flags.IsContained ||
      ((lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) && IsImplicit)) {
    auto &HT = *lr.Entry;
    IsNew = false;

    if (UpdateRefCount)
      ++HT.RefCount;

    uintptr_t tp = HT.TgtPtrBegin + ((uintptr_t)HstPtrBegin - HT.HstPtrBegin);
    DP("Mapping exists%s with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD ", "
        "Size=%ld,%s RefCount=%s\n", (IsImplicit ? " (implicit)" : ""),
        DPxPTR(HstPtrBegin), DPxPTR(tp), Size,
        (UpdateRefCount ? " updated" : ""),
        (CONSIDERED_INF(HT.RefCount)) ? "INF" :
            std::to_string(HT.RefCount).c_str());
    rc = (void *)tp;
  } else if ((lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) && !IsImplicit) {
    // Explicit extension of mapped data - not allowed.
    DP("Explicit extension of mapping is not allowed.\n");
  } else if (Size) {
    // If it is not contained and Size > 0 we should create a new entry for it.
    IsNew = true;
    uintptr_t tp = (uintptr_t)RTL->data_alloc(RTLDeviceID, Size, HstPtrBegin);
    DP("Creating new map entry: HstBase=" DPxMOD ", HstBegin=" DPxMOD ", "
        "HstEnd=" DPxMOD ", TgtBegin=" DPxMOD "\n", DPxPTR(HstPtrBase),
        DPxPTR(HstPtrBegin), DPxPTR((uintptr_t)HstPtrBegin + Size), DPxPTR(tp));
    HostDataToTargetMap.push_front(HostDataToTargetTy((uintptr_t)HstPtrBase,
        (uintptr_t)HstPtrBegin, (uintptr_t)HstPtrBegin + Size, tp));
    rc = (void *)tp;
  }

  DataMapMtx.unlock();
  return rc;
}